

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
outputBits(int nBits,uint64_t bits,uint64_t *c,int *lc,uint8_t **outptr,uint8_t *outend)

{
  int iVar1;
  ulong uVar2;
  uint8_t *out;
  uint8_t *outend_local;
  uint8_t **outptr_local;
  int *lc_local;
  uint64_t *c_local;
  uint64_t bits_local;
  int nBits_local;
  
  out = *outptr;
  *c = *c << ((byte)nBits & 0x3f);
  *lc = nBits + *lc;
  *c = bits | *c;
  while( true ) {
    if (*lc < 8) {
      *outptr = out;
      return 0;
    }
    if (outend <= out) break;
    uVar2 = *c;
    iVar1 = *lc;
    *lc = iVar1 + -8;
    *out = (uint8_t)(uVar2 >> ((byte)(iVar1 + -8) & 0x3f));
    out = out + 1;
  }
  return 4;
}

Assistant:

static inline exr_result_t
outputBits (int nBits, uint64_t bits, uint64_t* c, int* lc, uint8_t** outptr, uint8_t *outend)
{
    uint8_t* out = *outptr;
    *c <<= nBits;
    *lc += nBits;
    *c |= bits;

    while (*lc >= 8)
    {
        if (out >= outend) return EXR_ERR_ARGUMENT_OUT_OF_RANGE;
        *out++ = (uint8_t) (*c >> (*lc -= 8));
    }
    *outptr = out;
    return EXR_ERR_SUCCESS;
}